

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::leaf_node<char,_false>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
          (ref<immutable::rrb_details::leaf_node<char,_false>_> *this,
          ref<immutable::rrb_details::leaf_node<char,_false>_> *r)

{
  uint32_t uVar1;
  leaf_node<char,_false> *plVar2;
  leaf_node<char,_false> *__ptr;
  
  plVar2 = r->ptr;
  if (plVar2 != (leaf_node<char,_false> *)0x0) {
    plVar2->_ref_count = plVar2->_ref_count + 1;
  }
  __ptr = this->ptr;
  this->ptr = plVar2;
  if ((__ptr != (leaf_node<char,_false> *)0x0) &&
     (uVar1 = __ptr->_ref_count, __ptr->_ref_count = uVar1 - 1, uVar1 == 1)) {
    free(__ptr);
  }
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }